

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

bool operator!=(SimpleString *left,SimpleString *right)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  
  pcVar3 = left->buffer_;
  pcVar1 = right->buffer_;
  cVar2 = *pcVar3;
  if (cVar2 == '\0') {
    cVar2 = '\0';
  }
  else {
    do {
      pcVar3 = pcVar3 + 1;
      if (cVar2 != *pcVar1) goto LAB_00235a75;
      pcVar1 = pcVar1 + 1;
      cVar2 = *pcVar3;
    } while (cVar2 != '\0');
    cVar2 = '\0';
  }
LAB_00235a75:
  return cVar2 != *pcVar1;
}

Assistant:

const char* SimpleString::getBuffer() const
{
    return buffer_;
}